

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a1.cpp
# Opt level: O3

void __thiscall RasterizerA1::_renderImpl<CompositorScalar,true>(RasterizerA1 *this,uint32_t argb32)

{
  Image *pIVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int32_t *piVar11;
  long lVar12;
  uint32_t *dstPix;
  uint8_t *puVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  
  lVar6 = (long)(this->super_CellRasterizer).super_Rasterizer._height;
  if (0 < lVar6) {
    iVar9 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar7 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar5 = (iVar7 + 0x800080U >> 8 & 0xff00ff) + iVar7 + 0x800080;
    uVar10 = iVar9 + (iVar9 + 0x800080U >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff;
    pIVar1 = (this->super_CellRasterizer).super_Rasterizer._dst;
    lVar2 = pIVar1->_stride;
    puVar13 = pIVar1->_data;
    iVar7 = (this->super_CellRasterizer).super_Rasterizer._width;
    sVar3 = this->_cellStride;
    piVar11 = &this->_cells->area;
    lVar12 = 0;
    do {
      if (iVar7 != 0) {
        lVar14 = 0;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + piVar11[lVar14 * 2 + -1];
          uVar8 = iVar9 - (piVar11[lVar14 * 2] >> 9);
          uVar4 = -uVar8;
          if (0 < (int)uVar8) {
            uVar4 = uVar8;
          }
          *(undefined8 *)(piVar11 + lVar14 * 2 + -1) = 0;
          uVar8 = uVar5 & 0xff00ff00 | uVar10;
          if (uVar4 < 0xff) {
            iVar16 = uVar4 * uVar10 + (*(uint *)(puVar13 + lVar14 * 4) & 0xff00ff) * (0xff - uVar4);
            iVar15 = uVar4 * (uVar5 >> 8 & 0xff00ff) +
                     (0xff - uVar4) * (*(uint *)(puVar13 + lVar14 * 4) >> 8 & 0xff00ff);
            uVar8 = (iVar16 + 0x800080U >> 8 & 0xff00ff) + iVar16 + 0x800080 >> 8 & 0xff00ff |
                    (iVar15 + 0x800080U >> 8 & 0xff00ff) + iVar15 + 0x800080 & 0xff00ff00;
          }
          *(uint *)(puVar13 + lVar14 * 4) = uVar8;
          lVar14 = lVar14 + 1;
        } while (iVar7 != lVar14);
      }
      lVar12 = lVar12 + 1;
      puVar13 = puVar13 + lVar2;
      piVar11 = piVar11 + sVar3 * 2;
    } while (lVar12 != lVar6);
  }
  return;
}

Assistant:

inline void RasterizerA1::_renderImpl(uint32_t argb32) noexcept {
  int w = _width;
  int h = _height;

  uint8_t* dstLine = _dst->data();
  intptr_t stride = _dst->stride();

  Compositor compositor(argb32);
  for (int y = 0; y < h; y++, dstLine += stride) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y * _cellStride];

    size_t x0 = 0;
    int cover = 0;
    compositor.template vmask<NonZero>(dstPix, x0, w, cell, cover);
  }
}